

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O0

void __thiscall adios2::format::DataManSerializer::PutAttributes(DataManSerializer *this,IO *io)

{
  bool bVar1;
  int iVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  undefined8 uVar6;
  pointer pAVar7;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar8;
  Attribute<char> *pAVar9;
  Attribute<signed_char> *pAVar10;
  Attribute<short> *pAVar11;
  Attribute<int> *pAVar12;
  Attribute<long> *pAVar13;
  Attribute<unsigned_char> *pAVar14;
  Attribute<unsigned_short> *pAVar15;
  Attribute<unsigned_int> *pAVar16;
  Attribute<unsigned_long> *pAVar17;
  Attribute<float> *pAVar18;
  Attribute<double> *pAVar19;
  Attribute<std::complex<double>_> *pAVar20;
  IO *in_RSI;
  long in_RDI;
  json staticVar;
  Attribute<std::complex<double>_> *attribute_14;
  Attribute<std::complex<float>_> *attribute_13;
  Attribute<long_double> *attribute_12;
  Attribute<double> *attribute_11;
  Attribute<float> *attribute_10;
  Attribute<unsigned_long> *attribute_9;
  Attribute<unsigned_int> *attribute_8;
  Attribute<unsigned_short> *attribute_7;
  Attribute<unsigned_char> *attribute_6;
  Attribute<long> *attribute_5;
  Attribute<int> *attribute_4;
  Attribute<short> *attribute_3;
  Attribute<signed_char> *attribute_2;
  Attribute<char> *attribute_1;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute;
  DataType type;
  string name;
  value_type *attributePair;
  const_iterator __end2;
  const_iterator __begin2;
  AttrMap *__range2;
  bool attributePut;
  AttrMap *attributes;
  ScopedTimer __var277;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
  *in_stack_fffffffffffff648;
  reference in_stack_fffffffffffff650;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff658;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff660;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff6d8;
  Attribute<std::complex<float>_> *in_stack_fffffffffffff6e0;
  IO *in_stack_fffffffffffff6f0;
  string *in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff700;
  DataType in_stack_fffffffffffff704;
  IO *in_stack_fffffffffffff708;
  Attribute<long_double> *in_stack_fffffffffffff718;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff738;
  DataType in_stack_fffffffffffff73c;
  DataManSerializer *in_stack_fffffffffffff740;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_600;
  undefined1 local_5e9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_5e8 [4];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [32];
  Attribute<std::complex<double>_> *local_558;
  allocator local_549;
  string local_548 [39];
  string local_521;
  Attribute<std::complex<float>_> *local_500;
  undefined1 local_4f1;
  undefined1 local_4f0 [40];
  string local_4c8 [32];
  undefined1 local_4a8 [16];
  undefined1 local_498 [40];
  string local_470 [32];
  __node_base local_450;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  Attribute<float> *local_3f8;
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  Attribute<unsigned_long> *local_3a0;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [47];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  Attribute<unsigned_short> *local_2f0;
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  Attribute<unsigned_char> *local_298;
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  Attribute<long> *local_240;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  Attribute<int> *local_1e8;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  Attribute<short> *local_190;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  Attribute<signed_char> *local_138;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  Attribute<char> *local_e0;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  DataType local_7c;
  string local_78 [32];
  reference local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_48;
  AttrMap *local_40;
  byte local_31;
  AttrMap *local_30;
  IO *local_10;
  
  local_10 = in_RSI;
  if ((PutAttributes(adios2::core::IO&)::__var77 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&PutAttributes(adios2::core::IO&)::__var77), iVar2 != 0)) {
    uVar6 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,"void adios2::format::DataManSerializer::PutAttributes(core::IO &)"
                                ,0x4d);
    PutAttributes::__var77 = (void *)ps_timer_create_(uVar6);
    __cxa_guard_release(&PutAttributes(adios2::core::IO&)::__var77);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_40 = core::IO::GetAttributes_abi_cxx11_(local_10);
  local_31 = 0;
  local_30 = local_40;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::begin(in_stack_fffffffffffff648);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::end(in_stack_fffffffffffff648);
  while (bVar1 = std::__detail::operator!=(&local_48,&local_50), bVar1) {
    local_58 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)0xdc8c4b);
    std::__cxx11::string::string(local_78,(string *)local_58);
    pAVar7 = std::
             unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
             ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                           *)0xdc8c7b);
    DVar4 = pAVar7->m_Type;
    local_7c = DVar4;
    if (DVar4 != None) {
      DVar3 = helper::GetDataType<std::__cxx11::string>();
      DVar5 = local_7c;
      if (DVar4 == DVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"",&local_a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"/",&local_d1);
        pAVar8 = core::IO::InquireAttribute<std::__cxx11::string>
                           (in_stack_fffffffffffff708,
                            (string *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                            in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        local_88 = pAVar8;
        PutAttribute<std::__cxx11::string>
                  (in_stack_fffffffffffff740,
                   (Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      }
      else {
        DVar3 = helper::GetDataType<char>();
        DVar4 = local_7c;
        if (DVar5 == DVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_100,"",&local_101);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_128,"/",&local_129);
          pAVar9 = core::IO::InquireAttribute<char>
                             (in_stack_fffffffffffff708,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                              in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          std::__cxx11::string::~string(local_100);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
          local_e0 = pAVar9;
          PutAttribute<char>(in_stack_fffffffffffff740,
                             (Attribute<char> *)
                             CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        }
        else {
          DVar3 = helper::GetDataType<signed_char>();
          DVar5 = local_7c;
          if (DVar4 == DVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_158,"",&local_159);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_180,"/",&local_181);
            pAVar10 = core::IO::InquireAttribute<signed_char>
                                (in_stack_fffffffffffff708,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                                 in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator((allocator<char> *)&local_181);
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator((allocator<char> *)&local_159);
            local_138 = pAVar10;
            PutAttribute<signed_char>
                      (in_stack_fffffffffffff740,
                       (Attribute<signed_char> *)
                       CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
          }
          else {
            DVar3 = helper::GetDataType<short>();
            DVar4 = local_7c;
            if (DVar5 == DVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1b0,"",&local_1b1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1d8,"/",&local_1d9);
              pAVar11 = core::IO::InquireAttribute<short>
                                  (in_stack_fffffffffffff708,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                                   in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
              std::__cxx11::string::~string(local_1d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
              std::__cxx11::string::~string(local_1b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
              local_190 = pAVar11;
              PutAttribute<short>(in_stack_fffffffffffff740,
                                  (Attribute<short> *)
                                  CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
            }
            else {
              DVar3 = helper::GetDataType<int>();
              DVar5 = local_7c;
              if (DVar4 == DVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_208,"",&local_209);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_230,"/",&local_231);
                pAVar12 = core::IO::InquireAttribute<int>
                                    (in_stack_fffffffffffff708,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                                     in_stack_fffffffffffff6f8,(string *)in_stack_fffffffffffff6f0);
                std::__cxx11::string::~string(local_230);
                std::allocator<char>::~allocator((allocator<char> *)&local_231);
                std::__cxx11::string::~string(local_208);
                std::allocator<char>::~allocator((allocator<char> *)&local_209);
                local_1e8 = pAVar12;
                PutAttribute<int>(in_stack_fffffffffffff740,
                                  (Attribute<int> *)
                                  CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
              }
              else {
                DVar3 = helper::GetDataType<long>();
                DVar4 = local_7c;
                if (DVar5 == DVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_260,"",&local_261);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_288,"/",&local_289);
                  pAVar13 = core::IO::InquireAttribute<long>
                                      (in_stack_fffffffffffff708,
                                       (string *)
                                       CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700)
                                       ,in_stack_fffffffffffff6f8,
                                       (string *)in_stack_fffffffffffff6f0);
                  std::__cxx11::string::~string(local_288);
                  std::allocator<char>::~allocator((allocator<char> *)&local_289);
                  std::__cxx11::string::~string(local_260);
                  std::allocator<char>::~allocator((allocator<char> *)&local_261);
                  local_240 = pAVar13;
                  PutAttribute<long>(in_stack_fffffffffffff740,
                                     (Attribute<long> *)
                                     CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
                }
                else {
                  DVar3 = helper::GetDataType<unsigned_char>();
                  DVar5 = local_7c;
                  if (DVar4 == DVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2b8,"",&local_2b9);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2e0,"/",&local_2e1);
                    pAVar14 = core::IO::InquireAttribute<unsigned_char>
                                        (in_stack_fffffffffffff708,
                                         (string *)
                                         CONCAT44(in_stack_fffffffffffff704,
                                                  in_stack_fffffffffffff700),
                                         in_stack_fffffffffffff6f8,
                                         (string *)in_stack_fffffffffffff6f0);
                    std::__cxx11::string::~string(local_2e0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
                    std::__cxx11::string::~string(local_2b8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
                    local_298 = pAVar14;
                    PutAttribute<unsigned_char>
                              (in_stack_fffffffffffff740,
                               (Attribute<unsigned_char> *)
                               CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
                  }
                  else {
                    DVar3 = helper::GetDataType<unsigned_short>();
                    DVar4 = local_7c;
                    if (DVar5 == DVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_310,"",&local_311);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_338,"/",&local_339);
                      pAVar15 = core::IO::InquireAttribute<unsigned_short>
                                          (in_stack_fffffffffffff708,
                                           (string *)
                                           CONCAT44(in_stack_fffffffffffff704,
                                                    in_stack_fffffffffffff700),
                                           in_stack_fffffffffffff6f8,
                                           (string *)in_stack_fffffffffffff6f0);
                      std::__cxx11::string::~string(local_338);
                      std::allocator<char>::~allocator((allocator<char> *)&local_339);
                      std::__cxx11::string::~string(local_310);
                      std::allocator<char>::~allocator((allocator<char> *)&local_311);
                      local_2f0 = pAVar15;
                      PutAttribute<unsigned_short>
                                (in_stack_fffffffffffff740,
                                 (Attribute<unsigned_short> *)
                                 CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
                    }
                    else {
                      DVar3 = helper::GetDataType<unsigned_int>();
                      DVar5 = local_7c;
                      if (DVar4 == DVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_368,"",&local_369);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_390,"/",&local_391);
                        pAVar16 = core::IO::InquireAttribute<unsigned_int>
                                            (in_stack_fffffffffffff708,
                                             (string *)
                                             CONCAT44(in_stack_fffffffffffff704,
                                                      in_stack_fffffffffffff700),
                                             in_stack_fffffffffffff6f8,
                                             (string *)in_stack_fffffffffffff6f0);
                        std::__cxx11::string::~string(local_390);
                        std::allocator<char>::~allocator((allocator<char> *)&local_391);
                        std::__cxx11::string::~string(local_368);
                        std::allocator<char>::~allocator((allocator<char> *)&local_369);
                        local_368._32_8_ = pAVar16;
                        PutAttribute<unsigned_int>
                                  (in_stack_fffffffffffff740,
                                   (Attribute<unsigned_int> *)
                                   CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
                      }
                      else {
                        DVar3 = helper::GetDataType<unsigned_long>();
                        DVar4 = local_7c;
                        if (DVar5 == DVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_3c0,"",&local_3c1);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_3e8,"/",&local_3e9);
                          pAVar17 = core::IO::InquireAttribute<unsigned_long>
                                              (in_stack_fffffffffffff708,
                                               (string *)
                                               CONCAT44(in_stack_fffffffffffff704,
                                                        in_stack_fffffffffffff700),
                                               in_stack_fffffffffffff6f8,
                                               (string *)in_stack_fffffffffffff6f0);
                          std::__cxx11::string::~string(local_3e8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
                          std::__cxx11::string::~string(local_3c0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
                          local_3a0 = pAVar17;
                          PutAttribute<unsigned_long>
                                    (in_stack_fffffffffffff740,
                                     (Attribute<unsigned_long> *)
                                     CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
                        }
                        else {
                          DVar3 = helper::GetDataType<float>();
                          DVar5 = local_7c;
                          if (DVar4 == DVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_418,"",&local_419);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_440,"/",&local_441);
                            pAVar18 = core::IO::InquireAttribute<float>
                                                (in_stack_fffffffffffff708,
                                                 (string *)
                                                 CONCAT44(in_stack_fffffffffffff704,
                                                          in_stack_fffffffffffff700),
                                                 in_stack_fffffffffffff6f8,
                                                 (string *)in_stack_fffffffffffff6f0);
                            std::__cxx11::string::~string(local_440);
                            std::allocator<char>::~allocator((allocator<char> *)&local_441);
                            std::__cxx11::string::~string(local_418);
                            std::allocator<char>::~allocator((allocator<char> *)&local_419);
                            local_3f8 = pAVar18;
                            PutAttribute<float>(in_stack_fffffffffffff740,
                                                (Attribute<float> *)
                                                CONCAT44(in_stack_fffffffffffff73c,
                                                         in_stack_fffffffffffff738));
                          }
                          else {
                            DVar4 = helper::GetDataType<double>();
                            if (DVar5 == DVar4) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_470,"",(allocator *)(local_498 + 0x27));
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)local_498,"/",(allocator *)(local_4a8 + 0xf));
                              in_stack_fffffffffffff740 = (DataManSerializer *)local_498;
                              pAVar19 = core::IO::InquireAttribute<double>
                                                  (in_stack_fffffffffffff708,
                                                   (string *)
                                                   CONCAT44(in_stack_fffffffffffff704,
                                                            in_stack_fffffffffffff700),
                                                   in_stack_fffffffffffff6f8,
                                                   (string *)in_stack_fffffffffffff6f0);
                              std::__cxx11::string::~string((string *)in_stack_fffffffffffff740);
                              std::allocator<char>::~allocator((allocator<char> *)(local_4a8 + 0xf))
                              ;
                              std::__cxx11::string::~string(local_470);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(local_498 + 0x27));
                              local_450._M_nxt = (_Hash_node_base *)pAVar19;
                              PutAttribute<double>
                                        (in_stack_fffffffffffff740,
                                         (Attribute<double> *)
                                         CONCAT44(in_stack_fffffffffffff73c,
                                                  in_stack_fffffffffffff738));
                            }
                            else {
                              in_stack_fffffffffffff73c = local_7c;
                              DVar4 = helper::GetDataType<long_double>();
                              if (in_stack_fffffffffffff73c == DVar4) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_4c8,"",(allocator *)(local_4f0 + 0x27));
                                in_stack_fffffffffffff720 =
                                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)&local_4f1;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)local_4f0,"/",
                                           (allocator *)in_stack_fffffffffffff720);
                                in_stack_fffffffffffff708 = (IO *)local_4f0;
                                in_stack_fffffffffffff718 =
                                     core::IO::InquireAttribute<long_double>
                                               (in_stack_fffffffffffff708,
                                                (string *)
                                                CONCAT44(in_stack_fffffffffffff704,
                                                         in_stack_fffffffffffff700),
                                                in_stack_fffffffffffff6f8,
                                                (string *)in_stack_fffffffffffff6f0);
                                std::__cxx11::string::~string((string *)in_stack_fffffffffffff708);
                                std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
                                std::__cxx11::string::~string(local_4c8);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(local_4f0 + 0x27));
                                local_4a8._0_8_ = in_stack_fffffffffffff718;
                                PutAttribute<long_double>
                                          (in_stack_fffffffffffff740,
                                           (Attribute<long_double> *)
                                           CONCAT44(in_stack_fffffffffffff73c,
                                                    in_stack_fffffffffffff738));
                              }
                              else {
                                in_stack_fffffffffffff704 = local_7c;
                                DVar5 = helper::GetDataType<std::complex<float>>();
                                DVar4 = local_7c;
                                if (in_stack_fffffffffffff704 == DVar5) {
                                  in_stack_fffffffffffff6f8 = &local_521;
                                  in_stack_fffffffffffff6f0 = local_10;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_521.field_0x1,"",
                                             (allocator *)in_stack_fffffffffffff6f8);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_548,"/",&local_549);
                                  in_stack_fffffffffffff6d8 =
                                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        *)&local_521.field_0x1;
                                  in_stack_fffffffffffff6e0 =
                                       core::IO::InquireAttribute<std::complex<float>>
                                                 (in_stack_fffffffffffff708,
                                                  (string *)
                                                  CONCAT44(in_stack_fffffffffffff704,
                                                           in_stack_fffffffffffff700),
                                                  in_stack_fffffffffffff6f8,
                                                  (string *)in_stack_fffffffffffff6f0);
                                  std::__cxx11::string::~string(local_548);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_549);
                                  std::__cxx11::string::~string((string *)in_stack_fffffffffffff6d8)
                                  ;
                                  std::allocator<char>::~allocator((allocator<char> *)&local_521);
                                  local_500 = in_stack_fffffffffffff6e0;
                                  PutAttribute<std::complex<float>>
                                            (in_stack_fffffffffffff740,
                                             (Attribute<std::complex<float>_> *)
                                             CONCAT44(in_stack_fffffffffffff73c,
                                                      in_stack_fffffffffffff738));
                                }
                                else {
                                  DVar5 = helper::GetDataType<std::complex<double>>();
                                  if (DVar4 == DVar5) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_578,"",&local_579);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_5a0,"/",&local_5a1);
                                    pAVar20 = core::IO::InquireAttribute<std::complex<double>>
                                                        (in_stack_fffffffffffff708,
                                                         (string *)
                                                         CONCAT44(in_stack_fffffffffffff704,
                                                                  in_stack_fffffffffffff700),
                                                         in_stack_fffffffffffff6f8,
                                                         (string *)in_stack_fffffffffffff6f0);
                                    std::__cxx11::string::~string(local_5a0);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
                                    std::__cxx11::string::~string(local_578);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_579);
                                    local_558 = pAVar20;
                                    PutAttribute<std::complex<double>>
                                              (in_stack_fffffffffffff740,
                                               (Attribute<std::complex<double>_> *)
                                               CONCAT44(in_stack_fffffffffffff73c,
                                                        in_stack_fffffffffffff738));
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_31 = 1;
    std::__cxx11::string::~string(local_78);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)in_stack_fffffffffffff650);
  }
  if ((*(byte *)(in_RDI + 0x168) & 1) == 0) {
    if ((local_31 & 1) == 0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_char_(&)[13],_char[13],_0>
                (in_stack_fffffffffffff650,(char (*) [13])in_stack_fffffffffffff648);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(in_stack_fffffffffffff650);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_char_(&)[5],_char[5],_0>
                (in_stack_fffffffffffff650,(char (*) [5])in_stack_fffffffffffff648);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(in_stack_fffffffffffff650);
      local_5e9 = 1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<bool,_bool,_0>(in_stack_fffffffffffff650,(bool *)in_stack_fffffffffffff648);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718);
      this_00 = local_5e8;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(this_00,in_stack_fffffffffffff658);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(in_stack_fffffffffffff650);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<bool,_bool,_0>(in_stack_fffffffffffff650,(bool *)in_stack_fffffffffffff648);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(this_00,&local_600);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(in_stack_fffffffffffff650);
      std::mutex::lock((mutex *)in_stack_fffffffffffff650);
      in_stack_fffffffffffff650 =
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>(in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::
      emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
      std::mutex::unlock((mutex *)0xdca645);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(in_stack_fffffffffffff650);
    }
    *(undefined1 *)(in_RDI + 0x168) = 1;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffff650);
  return;
}

Assistant:

void DataManSerializer::PutAttributes(core::IO &io)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    const auto &attributes = io.GetAttributes();
    bool attributePut = false;
    for (const auto &attributePair : attributes)
    {
        const std::string name(attributePair.first);
        const DataType type(attributePair.second->m_Type);
        if (type == DataType::None)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Attribute<T> &attribute = *io.InquireAttribute<T>(name);                             \
        PutAttribute(attribute);                                                                   \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        attributePut = true;
    }

    if (!m_StaticDataFinished)
    {
        if (!attributePut)
        {
            nlohmann::json staticVar;
            staticVar["N"] = "NoAttributes";
            staticVar["Y"] = "bool";
            staticVar["V"] = true;
            staticVar["G"] = true;
            m_StaticDataJsonMutex.lock();
            m_StaticDataJson["S"].emplace_back(std::move(staticVar));
            m_StaticDataJsonMutex.unlock();
        }
        m_StaticDataFinished = true;
    }
}